

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cpp
# Opt level: O0

void __thiscall mjs::print_visitor::operator()(print_visitor *this,array_literal_expression *e)

{
  char *pcVar1;
  bool bVar2;
  vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  *this_00;
  size_type sVar3;
  unique_ptr *this_01;
  const_reference this_02;
  type e_00;
  ulong local_28;
  size_t i;
  vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  *es;
  array_literal_expression *e_local;
  print_visitor *this_local;
  
  std::operator<<(this->os_,'[');
  this_00 = array_literal_expression::elements(e);
  for (local_28 = 0;
      sVar3 = std::
              vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
              ::size(this_00), local_28 < sVar3; local_28 = local_28 + 1) {
    pcVar1 = "\t";
    if (local_28 != 0) {
      pcVar1 = "], ";
    }
    std::operator<<(this->os_,pcVar1 + 1);
    this_01 = (unique_ptr *)
              std::
              vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
              ::operator[](this_00,local_28);
    bVar2 = std::unique_ptr::operator_cast_to_bool(this_01);
    if (bVar2) {
      this_02 = std::
                vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                ::operator[](this_00,local_28);
      e_00 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                       (this_02);
      accept<mjs::print_visitor>(e_00,this);
    }
  }
  std::operator<<(this->os_,']');
  return;
}

Assistant:

void operator()(const array_literal_expression& e) {
        os_ << '[';
        const auto& es = e.elements();
        for (size_t i = 0; i < es.size(); ++i) {
            os_ << (i ? ", " : "");
            if (es[i]) {
                accept(*es[i], *this);
            }
        }
        os_ << ']';
    }